

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O0

void freeSignature2(signature2_t *sig,picnic_instance_t *params)

{
  long in_RSI;
  long in_RDI;
  size_t i;
  undefined8 local_18;
  
  if (in_RDI != 0) {
    free(*(void **)(in_RDI + 0x20));
    free(*(void **)(in_RDI + 0x30));
    for (local_18 = 0; local_18 < *(ushort *)(in_RSI + 4); local_18 = local_18 + 1) {
      freeProof2((proof2_t *)0x154526);
    }
    free(*(void **)(in_RDI + 0x58));
    free(*(void **)(in_RDI + 0x50));
    free(*(void **)(in_RDI + 0x48));
    free(*(void **)(in_RDI + 0x40));
  }
  return;
}

Assistant:

void freeSignature2(signature2_t* sig, const picnic_instance_t* params) {
  if (sig) {
    free(sig->iSeedInfo);
    free(sig->cvInfo);
    for (size_t i = 0; i < params->num_rounds; i++) {
      freeProof2(&sig->proofs[i]);
    }
    free(sig->proofs);
    free(sig->challengeP);
    free(sig->challengeC);
    free(sig->challenge);
  }
}